

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void add(sha512_ctx *ctx,void *p,size_t len)

{
  ulong local_30;
  size_t bufsize;
  uchar *data;
  size_t len_local;
  void *p_local;
  sha512_ctx *ctx_local;
  
  local_30 = ctx->bytes & 0x7f;
  bufsize = (size_t)p;
  data = (uchar *)len;
  if (0x7f < local_30 + len) {
    memcpy((void *)((long)ctx->s + local_30 + 0x40),p,0x80 - local_30);
    ctx->bytes = (0x80 - local_30) + ctx->bytes;
    bufsize = (0x80 - local_30) + (long)p;
    data = (uchar *)(len - (0x80 - local_30));
    Transform(ctx->s,(ctx->buf).u64);
    local_30 = 0;
  }
  for (; (uchar *)0x7f < data; data = data + -0x80) {
    Transform(ctx->s,(uint64_t *)bufsize);
    ctx->bytes = ctx->bytes + 0x80;
    bufsize = bufsize + 0x80;
  }
  if (data != (uchar *)0x0) {
    memcpy((void *)((long)ctx->s + local_30 + 0x40),(void *)bufsize,(size_t)data);
    ctx->bytes = (size_t)(data + ctx->bytes);
  }
  return;
}

Assistant:

static void add(struct sha256_ctx *ctx, const void *p, size_t len)
{
	const unsigned char *data = p;
	size_t bufsize = ctx->bytes % 64;

	if (bufsize + len >= 64) {
		/* Fill the buffer, and process it. */
		memcpy(ctx->buf.u8 + bufsize, data, 64 - bufsize);
		ctx->bytes += 64 - bufsize;
		data += 64 - bufsize;
		len -= 64 - bufsize;
		Transform(ctx->s, ctx->buf.u32, 1);
		bufsize = 0;
	}

	while (len >= 64) {
		/* Process full chunks directly from the source. */
		if (alignment_ok(data, sizeof(uint32_t))) {
			const size_t blocks = len / 64;
			Transform(ctx->s, (const uint32_t *)data, blocks);
			ctx->bytes += 64 * blocks;
			data += 64 * blocks;
			len -= 64 * blocks;
		} else {
			memcpy(ctx->buf.u8, data, sizeof(ctx->buf));
			Transform(ctx->s, ctx->buf.u32, 1);
			ctx->bytes += 64;
			data += 64;
			len -= 64;
		}
	}
	    
	if (len) {
		/* Fill the buffer with what remains. */
		memcpy(ctx->buf.u8 + bufsize, data, len);
		ctx->bytes += len;
	}
}